

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O0

void __thiscall OpenMD::MoLocator::calcRef(MoLocator *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *this_00;
  Vector<double,_3U> *v1;
  reference pvVar5;
  long in_RDI;
  RealType RVar6;
  RealType RVar7;
  size_t i_3;
  size_t i_2;
  size_t j;
  size_t nAtomsInRb;
  size_t i_1;
  size_t i;
  size_t nRigidBodies;
  size_t nAtoms;
  RealType molMass;
  RealType currAtomMass;
  RealType totMassInRb;
  Vector3d refMolCom;
  Vector3d coor;
  vector<double,_std::allocator<double>_> mass;
  RigidBodyStamp *rbStamp;
  AtomStamp *currAtomStamp;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  MoleculeStamp *in_stack_fffffffffffffd70;
  ForceField *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  ulong local_160;
  ulong local_140;
  string local_138 [32];
  ulong local_118;
  size_t local_110;
  ulong local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  ulong local_a0;
  size_t local_98;
  size_t local_90;
  double local_88;
  RealType local_80;
  double local_78;
  Vector3<double> local_70;
  Vector3<double> local_48;
  vector<double,_std::allocator<double>_> local_30;
  RigidBodyStamp *local_18;
  AtomStamp *local_10;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2d872c);
  Vector3<double>::Vector3((Vector3<double> *)0x2d8739);
  Vector3<double>::Vector3((Vector3<double> *)0x2d8748);
  local_90 = MoleculeStamp::getNAtoms((MoleculeStamp *)0x2d875a);
  local_98 = MoleculeStamp::getNRigidBodies((MoleculeStamp *)0x2d8784);
  for (local_a0 = 0; local_a0 < local_90; local_a0 = local_a0 + 1) {
    local_10 = MoleculeStamp::getAtomStamp(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    bVar1 = AtomStamp::havePosition(local_10);
    if (!bVar1) {
      MoleculeStamp::getName_abi_cxx11_
                ((MoleculeStamp *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      uVar2 = std::__cxx11::string::c_str();
      AtomStamp::getType_abi_cxx11_
                ((AtomStamp *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "MoLocator::calcRef error.\n\tComponent %s, atom %s does not have a position specified.\n\tThis means MoLocator cannot initalize it\'s position.\n"
               ,uVar2,uVar3);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      painCave.isFatal = 1;
      simError();
    }
    bVar1 = MoleculeStamp::isAtomInRigidBody(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    if (!bVar1) {
      AtomStamp::getType_abi_cxx11_
                ((AtomStamp *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_80 = getAtomMass(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string(local_100);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
                 (value_type_conflict2 *)in_stack_fffffffffffffd78);
      RVar6 = AtomStamp::getPosX((AtomStamp *)0x2d89c4);
      pdVar4 = Vector3<double>::x(&local_48);
      *pdVar4 = RVar6;
      RVar6 = AtomStamp::getPosY((AtomStamp *)0x2d8a08);
      pdVar4 = Vector3<double>::y(&local_48);
      *pdVar4 = RVar6;
      RVar6 = AtomStamp::getPosZ((AtomStamp *)0x2d8a4c);
      pdVar4 = Vector3<double>::z(&local_48);
      *pdVar4 = RVar6;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    }
  }
  for (local_108 = 0; local_108 < local_98; local_108 = local_108 + 1) {
    local_18 = MoleculeStamp::getRigidBodyStamp(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)
    ;
    local_110 = RigidBodyStamp::getNMembers((RigidBodyStamp *)0x2d8b41);
    pdVar4 = Vector3<double>::x(&local_48);
    *pdVar4 = 0.0;
    pdVar4 = Vector3<double>::y(&local_48);
    *pdVar4 = 0.0;
    pdVar4 = Vector3<double>::z(&local_48);
    *pdVar4 = 0.0;
    local_78 = 0.0;
    for (local_118 = 0; local_118 < local_110; local_118 = local_118 + 1) {
      RigidBodyStamp::getMemberAt
                ((RigidBodyStamp *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
      local_10 = MoleculeStamp::getAtomStamp(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
      AtomStamp::getType_abi_cxx11_
                ((AtomStamp *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      local_80 = getAtomMass(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::__cxx11::string::~string(local_138);
      local_78 = local_78 + local_80;
      RVar7 = AtomStamp::getPosX((AtomStamp *)0x2d8cd3);
      RVar6 = local_80;
      pdVar4 = Vector3<double>::x(&local_48);
      *pdVar4 = RVar7 * RVar6 + *pdVar4;
      RVar7 = AtomStamp::getPosY((AtomStamp *)0x2d8d2c);
      RVar6 = local_80;
      pdVar4 = Vector3<double>::y(&local_48);
      *pdVar4 = RVar7 * RVar6 + *pdVar4;
      RVar7 = AtomStamp::getPosZ((AtomStamp *)0x2d8d85);
      RVar6 = local_80;
      pdVar4 = Vector3<double>::z(&local_48);
      *pdVar4 = RVar7 * RVar6 + *pdVar4;
    }
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
               (value_type_conflict2 *)in_stack_fffffffffffffd78);
    Vector<double,_3U>::operator/=
              ((Vector<double,_3U> *)in_stack_fffffffffffffd70,
               (double)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
  }
  local_88 = 0.0;
  pdVar4 = Vector3<double>::x(&local_70);
  *pdVar4 = 0.0;
  this_00 = (vector<double,_std::allocator<double>_> *)Vector3<double>::y(&local_70);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  v1 = (Vector<double,_3U> *)Vector3<double>::z(&local_70);
  v1->data_[0] = 0.0;
  for (local_140 = 0; local_140 < *(uint *)(in_RDI + 0x28); local_140 = local_140 + 1) {
    in_stack_fffffffffffffd70 =
         (MoleculeStamp *)
         std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                   ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                    (in_RDI + 0x10),local_140);
    std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_140);
    OpenMD::operator*(v1,(double)in_stack_fffffffffffffd70);
    Vector<double,_3U>::operator+=
              ((Vector<double,_3U> *)in_stack_fffffffffffffd70,
               (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_140);
    local_88 = *pvVar5 + local_88;
  }
  Vector<double,_3U>::operator/=
            ((Vector<double,_3U> *)in_stack_fffffffffffffd70,
             (double)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  for (local_160 = 0; local_160 < *(uint *)(in_RDI + 0x28); local_160 = local_160 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               (in_RDI + 0x10),local_160);
    Vector<double,_3U>::operator-=
              ((Vector<double,_3U> *)in_stack_fffffffffffffd70,
               (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return;
}

Assistant:

void MoLocator::calcRef(void) {
    AtomStamp* currAtomStamp;
    RigidBodyStamp* rbStamp;
    std::vector<RealType> mass;
    Vector3d coor;
    Vector3d refMolCom;
    RealType totMassInRb;
    RealType currAtomMass;
    RealType molMass;

    std::size_t nAtoms       = myStamp->getNAtoms();
    std::size_t nRigidBodies = myStamp->getNRigidBodies();

    for (std::size_t i = 0; i < nAtoms; i++) {
      currAtomStamp = myStamp->getAtomStamp(i);

      if (!currAtomStamp->havePosition()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoLocator::calcRef error.\n"
                 "\tComponent %s, atom %s does not have a position specified.\n"
                 "\tThis means MoLocator cannot initalize it's position.\n",
                 myStamp->getName().c_str(), currAtomStamp->getType().c_str());

        painCave.isFatal = 1;
        simError();
      }

      // if atom belongs to rigidbody, just skip it
      if (myStamp->isAtomInRigidBody(i)) continue;
      // get mass and the reference coordinate
      else {
        currAtomMass = getAtomMass(currAtomStamp->getType(), myFF);
        mass.push_back(currAtomMass);
        coor.x() = currAtomStamp->getPosX();
        coor.y() = currAtomStamp->getPosY();
        coor.z() = currAtomStamp->getPosZ();
        refCoords.push_back(coor);
      }
    }

    for (std::size_t i = 0; i < nRigidBodies; i++) {
      rbStamp                = myStamp->getRigidBodyStamp(i);
      std::size_t nAtomsInRb = rbStamp->getNMembers();

      coor.x()    = 0.0;
      coor.y()    = 0.0;
      coor.z()    = 0.0;
      totMassInRb = 0.0;

      for (std::size_t j = 0; j < nAtomsInRb; j++) {
        currAtomStamp = myStamp->getAtomStamp(rbStamp->getMemberAt(j));
        currAtomMass  = getAtomMass(currAtomStamp->getType(), myFF);
        totMassInRb += currAtomMass;

        coor.x() += currAtomStamp->getPosX() * currAtomMass;
        coor.y() += currAtomStamp->getPosY() * currAtomMass;
        coor.z() += currAtomStamp->getPosZ() * currAtomMass;
      }

      mass.push_back(totMassInRb);
      coor /= totMassInRb;
      refCoords.push_back(coor);
    }

    // calculate the reference center of mass
    molMass       = 0;
    refMolCom.x() = 0;
    refMolCom.y() = 0;
    refMolCom.z() = 0;

    for (std::size_t i = 0; i < nIntegrableObjects; i++) {
      refMolCom += refCoords[i] * mass[i];
      molMass += mass[i];
    }

    refMolCom /= molMass;

    // move the reference center of mass to (0,0,0) and adjust the
    // reference coordinate of the integrabel objects
    for (std::size_t i = 0; i < nIntegrableObjects; i++)
      refCoords[i] -= refMolCom;
  }